

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int make_boot_catalog(archive_write *a)

{
  void *pvVar1;
  uint16_t uVar2;
  int iVar3;
  uchar *__s;
  uchar *local_38;
  uint16_t *wp;
  uint16_t sum;
  uchar *p;
  uchar *block;
  iso9660_conflict *iso9660;
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  __s = wb_buffptr(a);
  memset(__s,0,0x800);
  *__s = '\x01';
  __s[1] = *(uchar *)((long)pvVar1 + 0x10348);
  __s[3] = '\0';
  __s[2] = '\0';
  if (*(long *)((long)pvVar1 + 0x10358) != 0) {
    strncpy((char *)(__s + 4),*(char **)((long)pvVar1 + 0x10350),0x17);
  }
  __s[0x1b] = '\0';
  __s[0x1d] = '\0';
  __s[0x1c] = '\0';
  __s[0x1e] = 'U';
  __s[0x1f] = 0xaa;
  wp._6_2_ = 0;
  local_38 = __s;
  while (local_38 < __s + 0x20) {
    uVar2 = archive_le16dec(local_38);
    wp._6_2_ = wp._6_2_ + uVar2;
    local_38 = local_38 + 2;
  }
  set_num_721(__s + 0x1c,(wp._6_2_ ^ 0xffff) + 1);
  __s[0x20] = 0x88;
  __s[0x21] = *(uchar *)((long)pvVar1 + 0x10368);
  if (*(char *)((long)pvVar1 + 0x10368) == '\0') {
    set_num_721(__s + 0x22,*(uint16_t *)((long)pvVar1 + 0x1036a));
  }
  else {
    set_num_721(__s + 0x22,0);
  }
  __s[0x24] = *(uchar *)((long)pvVar1 + 0x10369);
  __s[0x25] = '\0';
  if (*(char *)((long)pvVar1 + 0x10368) == '\0') {
    set_num_721(__s + 0x26,*(uint16_t *)((long)pvVar1 + 0x1036c));
  }
  else {
    set_num_721(__s + 0x26,1);
  }
  set_num_731(__s + 0x28,*(uint32_t *)(*(long *)(*(long *)((long)pvVar1 + 0x10340) + 0x18) + 0xa4));
  memset(__s + 0x2c,0,0x14);
  iVar3 = wb_consume(a,0x800);
  return iVar3;
}

Assistant:

static int
make_boot_catalog(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	unsigned char *block;
	unsigned char *p;
	uint16_t sum, *wp;

	block = wb_buffptr(a);
	memset(block, 0, LOGICAL_BLOCK_SIZE);
	p = block;
	/*
	 * Validation Entry
	 */
	/* Header ID */
	p[0] = 1;
	/* Platform ID */
	p[1] = iso9660->el_torito.platform_id;
	/* Reserved */
	p[2] = p[3] = 0;
	/* ID */
	if (archive_strlen(&(iso9660->el_torito.id)) > 0)
		strncpy((char *)p+4, iso9660->el_torito.id.s, 23);
	p[27] = 0;
	/* Checksum */
	p[28] = p[29] = 0;
	/* Key */
	p[30] = 0x55;
	p[31] = 0xAA;

	sum = 0;
	wp = (uint16_t *)block;
	while (wp < (uint16_t *)&block[32])
		sum += archive_le16dec(wp++);
	set_num_721(&block[28], (~sum) + 1);

	/*
	 * Initial/Default Entry
	 */
	p = &block[32];
	/* Boot Indicator */
	p[0] = 0x88;
	/* Boot media type */
	p[1] = iso9660->el_torito.media_type;
	/* Load Segment */
	if (iso9660->el_torito.media_type == BOOT_MEDIA_NO_EMULATION)
		set_num_721(&p[2], iso9660->el_torito.boot_load_seg);
	else
		set_num_721(&p[2], 0);
	/* System Type */
	p[4] = iso9660->el_torito.system_type;
	/* Unused */
	p[5] = 0;
	/* Sector Count */
	if (iso9660->el_torito.media_type == BOOT_MEDIA_NO_EMULATION)
		set_num_721(&p[6], iso9660->el_torito.boot_load_size);
	else
		set_num_721(&p[6], 1);
	/* Load RBA */
	set_num_731(&p[8],
	    iso9660->el_torito.boot->file->content.location);
	/* Unused */
	memset(&p[12], 0, 20);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}